

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_remove_music.hpp
# Opt level: O0

void __thiscall PatchRemoveMusic::inject_code(PatchRemoveMusic *this,ROM *rom,World *world)

{
  World *this_00;
  Code *pCVar1;
  Code local_a8;
  uint32_t local_24;
  World *pWStack_20;
  uint32_t func_check_tree_map_addr;
  World *world_local;
  ROM *rom_local;
  PatchRemoveMusic *this_local;
  
  pWStack_20 = world;
  world_local = (World *)rom;
  rom_local = (ROM *)this;
  local_24 = inject_func_check_tree_map(this,rom);
  this_00 = world_local;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._labels._M_t._M_impl._0_8_ = 0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._pending_branches._M_t._M_impl._0_8_ = 0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  md::Code::Code(&local_a8);
  pCVar1 = md::Code::jsr(&local_a8,local_24);
  pCVar1 = md::Code::nop(pCVar1,1);
  md::ROM::set_code((ROM *)this_00,0x6310,pCVar1);
  md::Code::~Code(&local_a8);
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        // Inject a function checking on the tree maps table to check if we should trigger
        // a "wave-y" teleportation effect or the regular one
        uint32_t func_check_tree_map_addr = inject_func_check_tree_map(rom);
        rom.set_code(0x6310, md::Code().jsr(func_check_tree_map_addr).nop());

        // This code was used to fix the check removing enemies once Tibor had been saved (which was also relying
        // on music). This is not useful anymore with the flexible mapsetup system which attaches the procedure
        // to the correct Tibor maps directly, not relying on music anymore.
        // rom.set_code(0x1A034, md::Code().jsr(func_check_tree_map_addr).nop());
    }